

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGhsMultiGenerator::~cmGlobalGhsMultiGenerator(cmGlobalGhsMultiGenerator *this)

{
  ~cmGlobalGhsMultiGenerator(this);
  operator_delete(this,0x640);
  return;
}

Assistant:

cmGlobalGhsMultiGenerator::~cmGlobalGhsMultiGenerator() = default;